

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_vector.c
# Opt level: O2

exr_result_t
exr_attr_float_vector_init_static
          (exr_context_t ctxt,exr_attr_float_vector_t *fv,float *arr,int32_t nent)

{
  exr_result_t eVar1;
  code *UNRECOVERED_JUMPTABLE;
  char *pcVar2;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if (-1 < nent) {
    if (fv == (exr_attr_float_vector_t *)0x0) {
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar2 = "Invalid reference to float vector object to initialize";
    }
    else {
      if (arr != (float *)0x0) {
        fv->arr = arr;
        fv->length = nent;
        fv->alloc_size = 0;
        return 0;
      }
      UNRECOVERED_JUMPTABLE = *(code **)(ctxt + 0x40);
      pcVar2 = "Invalid reference to float array object to initialize";
    }
    eVar1 = (*UNRECOVERED_JUMPTABLE)(ctxt,3,pcVar2);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,3,"Received request to allocate negative sized float vector (%d entries)",
                     nent,*(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_float_vector_init_static (
    exr_context_t            ctxt,
    exr_attr_float_vector_t* fv,
    const float*             arr,
    int32_t                  nent)
{
    exr_attr_float_vector_t nil = {0};

    INTERN_EXR_PROMOTE_CONTEXT_OR_ERROR (ctxt);

    if (nent < 0)
        return pctxt->print_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Received request to allocate negative sized float vector (%d entries)",
            nent);
    if (!fv)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float vector object to initialize");
    if (!arr)
        return pctxt->report_error (
            pctxt,
            EXR_ERR_INVALID_ARGUMENT,
            "Invalid reference to float array object to initialize");

    *fv            = nil;
    fv->arr        = arr;
    fv->length     = nent;
    fv->alloc_size = 0;
    return EXR_ERR_SUCCESS;
}